

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O3

bool psy::C::isDiagnosticDescriptorIdOfSyntaxAmbiguity(string *id)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = id->_M_string_length;
  if (__n == Parser::DiagnosticsReporter::ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_.
             _M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((id->_M_dataplus)._M_p,
                 Parser::DiagnosticsReporter::ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_.
                 _M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == Parser::DiagnosticsReporter::ID_of_AmbiguousExpressionOrDeclarationStatement_abi_cxx11_
             ._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((id->_M_dataplus)._M_p,
                 Parser::DiagnosticsReporter::
                 ID_of_AmbiguousExpressionOrDeclarationStatement_abi_cxx11_._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == Parser::DiagnosticsReporter::
             ID_of_AmbiguousTypeNameOrExpressionAsTypeReference_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((id->_M_dataplus)._M_p,
                   Parser::DiagnosticsReporter::
                   ID_of_AmbiguousTypeNameOrExpressionAsTypeReference_abi_cxx11_._M_dataplus._M_p,
                   __n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isDiagnosticDescriptorIdOfSyntaxAmbiguity(const std::string& id)
{
    return id == Parser::DiagnosticsReporter::ID_of_AmbiguousCastOrBinaryExpression
            || id == Parser::DiagnosticsReporter::ID_of_AmbiguousExpressionOrDeclarationStatement
            || id == Parser::DiagnosticsReporter::ID_of_AmbiguousTypeNameOrExpressionAsTypeReference;
}